

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O0

void * be2ne(void *s,size_t len)

{
  int iVar1;
  void *local_20;
  size_t len_local;
  void *s_local;
  
  iVar1 = little_endian();
  local_20 = s;
  if (iVar1 != 0) {
    local_20 = swap_bytes(s,len);
  }
  return local_20;
}

Assistant:

static void* be2ne(void* s, size_t len)
{
    return little_endian() ? swap_bytes(s, len) : s;
}